

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5ChunkIterate(Fts5Index *p,Fts5SegIter *pSeg,void *pCtx,
                     _func_void_Fts5Index_ptr_void_ptr_u8_ptr_int *xChunk)

{
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int pgnoSave;
  int pgno;
  int nChunk;
  u8 *pChunk;
  Fts5Data *pData;
  int nRem;
  _func_void_Fts5Index_ptr_void_ptr_u8_ptr_int *xChunk_local;
  void *pCtx_local;
  Fts5SegIter *pSeg_local;
  Fts5Index *p_local;
  
  pData._4_4_ = pSeg->nPos;
  pChunk = (u8 *)0x0;
  _pgno = pSeg->pLeaf->p + pSeg->iLeafOffset;
  local_50 = pData._4_4_;
  if (pSeg->pLeaf->szLeaf - pSeg->iLeafOffset <= pData._4_4_) {
    local_50 = pSeg->pLeaf->szLeaf - pSeg->iLeafOffset;
  }
  pgnoSave = local_50;
  local_48 = pSeg->iLeafPgno;
  local_4c = 0;
  if ((pSeg->flags & 2U) == 0) {
    local_4c = local_48 + 1;
  }
  while( true ) {
    (*xChunk)(p,pCtx,_pgno,pgnoSave);
    pData._4_4_ = pData._4_4_ - pgnoSave;
    fts5DataRelease((Fts5Data *)pChunk);
    if (pData._4_4_ < 1) {
      return;
    }
    local_48 = local_48 + 1;
    pChunk = (u8 *)fts5LeafRead(p,((long)pSeg->pSeg->iSegid << 0x25) + (long)local_48);
    if ((Fts5Data *)pChunk == (Fts5Data *)0x0) break;
    _pgno = ((Fts5Data *)pChunk)->p + 4;
    local_54 = pData._4_4_;
    if (((Fts5Data *)pChunk)->szLeaf + -4 <= pData._4_4_) {
      local_54 = ((Fts5Data *)pChunk)->szLeaf + -4;
    }
    pgnoSave = local_54;
    if (local_48 == local_4c) {
      pSeg->pNextLeaf = (Fts5Data *)pChunk;
      pChunk = (u8 *)0x0;
    }
  }
  return;
}

Assistant:

static void fts5ChunkIterate(
  Fts5Index *p,                   /* Index object */
  Fts5SegIter *pSeg,              /* Poslist of this iterator */
  void *pCtx,                     /* Context pointer for xChunk callback */
  void (*xChunk)(Fts5Index*, void*, const u8*, int)
){
  int nRem = pSeg->nPos;          /* Number of bytes still to come */
  Fts5Data *pData = 0;
  u8 *pChunk = &pSeg->pLeaf->p[pSeg->iLeafOffset];
  int nChunk = MIN(nRem, pSeg->pLeaf->szLeaf - pSeg->iLeafOffset);
  int pgno = pSeg->iLeafPgno;
  int pgnoSave = 0;

  /* This function does notmwork with detail=none databases. */
  assert( p->pConfig->eDetail!=FTS5_DETAIL_NONE );

  if( (pSeg->flags & FTS5_SEGITER_REVERSE)==0 ){
    pgnoSave = pgno+1;
  }

  while( 1 ){
    xChunk(p, pCtx, pChunk, nChunk);
    nRem -= nChunk;
    fts5DataRelease(pData);
    if( nRem<=0 ){
      break;
    }else{
      pgno++;
      pData = fts5LeafRead(p, FTS5_SEGMENT_ROWID(pSeg->pSeg->iSegid, pgno));
      if( pData==0 ) break;
      pChunk = &pData->p[4];
      nChunk = MIN(nRem, pData->szLeaf - 4);
      if( pgno==pgnoSave ){
        assert( pSeg->pNextLeaf==0 );
        pSeg->pNextLeaf = pData;
        pData = 0;
      }
    }
  }
}